

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int stbtt__isfont(stbtt_uint8 *font)

{
  stbtt_uint8 *font_local;
  int local_4;
  
  if ((((*font == '1') && (font[1] == '\0')) && (font[2] == '\0')) && (font[3] == '\0')) {
    local_4 = 1;
  }
  else if (((*font == 't') && (font[1] == 'y')) && ((font[2] == 'p' && (font[3] == '1')))) {
    local_4 = 1;
  }
  else if (((*font == 'O') && (font[1] == 'T')) && ((font[2] == 'T' && (font[3] == 'O')))) {
    local_4 = 1;
  }
  else if ((((*font == '\0') && (font[1] == '\x01')) && (font[2] == '\0')) && (font[3] == '\0')) {
    local_4 = 1;
  }
  else if (((*font == 't') && (font[1] == 'r')) && ((font[2] == 'u' && (font[3] == 'e')))) {
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int stbtt__isfont(stbtt_uint8 *font)
{
/*  check the version number */
if (stbtt_tag4(font, '1',0,0,0))  return 1; /*  TrueType 1 */
if (stbtt_tag(font, "typ1"))   return 1; /*  TrueType with type 1 font -- we don't support this! */
if (stbtt_tag(font, "OTTO"))   return 1; /*  OpenType with CFF */
if (stbtt_tag4(font, 0,1,0,0)) return 1; /*  OpenType 1.0 */
if (stbtt_tag(font, "true"))   return 1; /*  Apple specification for TrueType fonts */
return 0;
}